

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsrv2.c
# Opt level: O0

_Bool olsrv2_mpr_shall_forwarding
                (rfc5444_reader_tlvblock_context *context,netaddr *source_address,uint64_t vtime)

{
  byte bVar1;
  oonf_rfc5444_interface *poVar2;
  oonf_log_source oVar3;
  int iVar4;
  undefined8 uVar5;
  avl_tree *paVar6;
  char *pcVar7;
  char *pcVar8;
  bool bVar9;
  undefined8 in_stack_fffffffffffffdf0;
  undefined4 uVar10;
  undefined8 in_stack_fffffffffffffdf8;
  undefined4 uVar11;
  undefined8 in_stack_fffffffffffffe00;
  undefined4 uVar12;
  bool local_1d1;
  long local_1c8;
  long local_1c0;
  undefined1 local_1b3 [8];
  netaddr_str buf;
  _Bool forward;
  oonf_duplicate_result dup_result;
  nhdp_neighbor *neigh;
  nhdp_laddr *laddr;
  nhdp_interface *interf;
  uint64_t vtime_local;
  netaddr *source_address_local;
  rfc5444_reader_tlvblock_context *context_local;
  
  uVar11 = (undefined4)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
  uVar12 = (undefined4)((ulong)in_stack_fffffffffffffe00 >> 0x20);
  uVar10 = (undefined4)((ulong)in_stack_fffffffffffffdf0 >> 0x20);
  if (((context->has_origaddr & 1U) == 0) || ((context->has_seqno & 1U) == 0)) {
    if (((&log_global_mask)[LOG_OLSRV2] & 1) != 0) {
      oonf_log(1,LOG_OLSRV2,"src/olsrv2/olsrv2/olsrv2.c",0x1bb,0,0,
               "Do not forward message type %u, originator or sequence number is missing!",
               CONCAT44(uVar10,(uint)context->msg_type));
    }
    context_local._7_1_ = false;
  }
  else if ((_protocol->input).interface == (oonf_rfc5444_interface *)0x0) {
    if (((&log_global_mask)[LOG_OLSRV2] & 1) != 0) {
      oonf_log(1,LOG_OLSRV2,"src/olsrv2/olsrv2/olsrv2.c",0x1c1,0,0,
               "Do not forward because input interface is not set");
    }
    context_local._7_1_ = false;
  }
  else if (source_address == (netaddr *)0x0) {
    if (((&log_global_mask)[LOG_OLSRV2] & 1) != 0) {
      oonf_log(1,LOG_OLSRV2,"src/olsrv2/olsrv2/olsrv2.c",0x1c7,0,0,
               "Do not forward because input source is not set");
    }
    context_local._7_1_ = false;
  }
  else {
    iVar4 = strcmp(((_protocol->input).interface)->name,"any");
    if (iVar4 == 0) {
      context_local._7_1_ = false;
    }
    else {
      buf.buf._55_4_ =
           oonf_duplicate_entry_add
                     (&_protocol->forwarded_set,context->msg_type,&context->orig_addr,
                      (ulong)context->seqno,vtime + _olsrv2_config.f_hold_time);
      oVar3 = LOG_OLSRV2;
      bVar9 = true;
      if ((buf.buf._55_4_ != OONF_DUPSET_NEW) &&
         (bVar9 = true, buf.buf._55_4_ != OONF_DUPSET_NEWEST)) {
        bVar9 = buf.buf._55_4_ == OONF_DUPSET_FIRST;
      }
      if (bVar9) {
        poVar2 = (_protocol->input).interface;
        paVar6 = nhdp_interface_get_tree();
        local_1c0 = avl_find(paVar6,poVar2);
        if (local_1c0 == 0) {
          local_1c0 = 0;
        }
        else {
          local_1c0 = local_1c0 + -0x158;
        }
        if (local_1c0 == 0) {
          if (((&log_global_mask)[LOG_OLSRV2] & 1) != 0) {
            oonf_log(1,LOG_OLSRV2,"src/olsrv2/olsrv2/olsrv2.c",0x1e1,0,0,
                     "Do not forward because NHDP does not handle interface \'%s\'",
                     (_protocol->input).interface);
          }
          context_local._7_1_ = false;
        }
        else {
          local_1c8 = avl_find(local_1c0 + 0x1c8,source_address);
          oVar3 = LOG_OLSRV2;
          if (local_1c8 == 0) {
            local_1c8 = 0;
          }
          else {
            local_1c8 = local_1c8 + -0x98;
          }
          if (local_1c8 == 0) {
            if (((&log_global_mask)[LOG_OLSRV2] & 1) != 0) {
              uVar5 = netaddr_to_prefixstring(local_1b3,source_address,0);
              oonf_log(1,oVar3,"src/olsrv2/olsrv2/olsrv2.c",0x1eb,0,0,
                       "Do not forward because source IP %s is not a direct neighbor",uVar5);
            }
            context_local._7_1_ = false;
          }
          else {
            if ((context->orig_addr)._type == source_address->_type) {
              unique0x00012000 = *(long *)(*(long *)(local_1c8 + 0x18) + 0x148);
            }
            else {
              if (*(long *)(*(long *)(local_1c8 + 0x18) + 0x140) == 0) {
                if (((&log_global_mask)[LOG_OLSRV2] & 1) != 0) {
                  uVar5 = netaddr_to_prefixstring(local_1b3,source_address,0);
                  oonf_log(1,oVar3,"src/olsrv2/olsrv2/olsrv2.c",0x1fb,0,0,
                           "Do not forward because this is a dualstack message, but the link source %s is not dualstack capable"
                           ,uVar5);
                }
                return false;
              }
              unique0x00012000 = *(long *)(*(long *)(*(long *)(local_1c8 + 0x18) + 0x140) + 0x148);
            }
            local_1d1 = false;
            if ((*(byte *)(*(long *)(local_1c8 + 0x18) + 0x180) & 1) != 0) {
              local_1d1 = 0 < *(int *)(stack0xfffffffffffffe90 + 0x14);
            }
            buf.buf[0x36] = local_1d1;
            if (((&log_global_mask)[LOG_OLSRV2] & 1) != 0) {
              pcVar8 = "not ";
              if (local_1d1 != false) {
                pcVar8 = "";
              }
              bVar1 = context->msg_type;
              uVar5 = netaddr_to_prefixstring(local_1b3,&context->orig_addr,0);
              pcVar7 = "false";
              if ((*(byte *)(*(long *)(local_1c8 + 0x18) + 0x180) & 1) != 0) {
                pcVar7 = "true";
              }
              oonf_log(1,oVar3,"src/olsrv2/olsrv2/olsrv2.c",0x205,0,0,
                       "Do %sforward message type %u from %s with seqno %u (%s/%u)",pcVar8,
                       CONCAT44(uVar11,(uint)bVar1),uVar5,context->seqno,pcVar7,
                       *(undefined4 *)(stack0xfffffffffffffe90 + 0x14));
            }
            context_local._7_1_ = (_Bool)(buf.buf[0x36] & 1);
          }
        }
      }
      else {
        if (((&log_global_mask)[LOG_OLSRV2] & 1) != 0) {
          bVar1 = context->msg_type;
          uVar5 = netaddr_to_prefixstring(local_1b3,&context->orig_addr,0);
          oonf_log(1,oVar3,"src/olsrv2/olsrv2/olsrv2.c",0x1d7,0,0,
                   "Do not forward message type %u from %s with seqno %u (dupset result: %u)",
                   CONCAT44(uVar10,(uint)bVar1),uVar5,CONCAT44(uVar12,(uint)context->seqno),
                   buf.buf._55_4_);
        }
        context_local._7_1_ = false;
      }
    }
  }
  return context_local._7_1_;
}

Assistant:

bool
olsrv2_mpr_shall_forwarding(
  struct rfc5444_reader_tlvblock_context *context, struct netaddr *source_address, uint64_t vtime) {
  struct nhdp_interface *interf;
  struct nhdp_laddr *laddr;
  struct nhdp_neighbor *neigh;
  enum oonf_duplicate_result dup_result;
  bool forward;
#ifdef OONF_LOG_DEBUG_INFO
  struct netaddr_str buf;
#endif

  /* check if message has originator and sequence number */
  if (!context->has_origaddr || !context->has_seqno) {
    OONF_DEBUG(LOG_OLSRV2,
      "Do not forward message type %u,"
      " originator or sequence number is missing!",
      context->msg_type);
    return false;
  }

  /* check input interface */
  if (_protocol->input.interface == NULL) {
    OONF_DEBUG(LOG_OLSRV2, "Do not forward because input interface is not set");
    return false;
  }

  /* check input source address */
  if (!source_address) {
    OONF_DEBUG(LOG_OLSRV2, "Do not forward because input source is not set");
    return false;
  }

  /* check if this is coming from the unicast receiver */
  if (strcmp(_protocol->input.interface->name, RFC5444_UNICAST_INTERFACE) == 0) {
    return false;
  }

  /* check forwarding set */
  dup_result = oonf_duplicate_entry_add(&_protocol->forwarded_set, context->msg_type, &context->orig_addr,
    context->seqno, vtime + _olsrv2_config.f_hold_time);
  if (!oonf_duplicate_is_new(dup_result)) {
    OONF_DEBUG(LOG_OLSRV2,
      "Do not forward message type %u from %s"
      " with seqno %u (dupset result: %u)",
      context->msg_type, netaddr_to_string(&buf, &context->orig_addr), context->seqno, dup_result);
    return false;
  }

  /* get NHDP interface */
  interf = nhdp_interface_get(_protocol->input.interface->name);
  if (interf == NULL) {
    OONF_DEBUG(LOG_OLSRV2,
      "Do not forward because NHDP does not handle"
      " interface '%s'",
      _protocol->input.interface->name);
    return false;
  }

  /* get NHDP link address corresponding to source */
  laddr = nhdp_interface_get_link_addr(interf, source_address);
  if (laddr == NULL) {
    OONF_DEBUG(LOG_OLSRV2,
      "Do not forward because source IP %s is"
      " not a direct neighbor",
      netaddr_to_string(&buf, source_address));
    return false;
  }

  if (netaddr_get_address_family(&context->orig_addr) == netaddr_get_address_family(source_address)) {
    /* get NHDP neighbor */
    neigh = laddr->link->neigh;
  }
  else if (laddr->link->dualstack_partner) {
    /* get dualstack NHDP neighbor */
    neigh = laddr->link->dualstack_partner->neigh;
  }
  else {
    OONF_DEBUG(LOG_OLSRV2,
      "Do not forward because this is a dualstack"
      " message, but the link source %s is not dualstack capable",
      netaddr_to_string(&buf, source_address));
    return false;
  }

  /* forward if this neighbor has selected us as a flooding MPR */
  forward = laddr->link->local_is_flooding_mpr && neigh->symmetric > 0;
  OONF_DEBUG(LOG_OLSRV2,
    "Do %sforward message type %u from %s"
    " with seqno %u (%s/%u)",
    forward ? "" : "not ", context->msg_type, netaddr_to_string(&buf, &context->orig_addr), context->seqno,
    laddr->link->local_is_flooding_mpr ? "true" : "false", neigh->symmetric);
  return forward;
}